

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

void pybind11::class_<sophia_interface,_std::shared_ptr<sophia_interface>_>::init_instance
               (instance *inst,void *holder_ptr)

{
  bool bVar1;
  type_info *find_type;
  undefined1 local_48 [8];
  value_and_holder v_h;
  
  v_h.vh = &sophia_interface::typeinfo;
  find_type = detail::get_type_info((type_index *)&v_h.vh,false);
  detail::instance::get_value_and_holder((value_and_holder *)local_48,inst,find_type,true);
  bVar1 = detail::value_and_holder::instance_registered((value_and_holder *)local_48);
  if (!bVar1) {
    detail::register_instance(inst,(v_h.type)->type,(type_info *)v_h.index);
    detail::value_and_holder::set_instance_registered((value_and_holder *)local_48,true);
  }
  init_holder(inst,(value_and_holder *)local_48,(holder_type *)holder_ptr,(v_h.type)->type);
  return;
}

Assistant:

static void init_instance(detail::instance *inst, const void *holder_ptr) {
        auto v_h = inst->get_value_and_holder(detail::get_type_info(typeid(type)));
        if (!v_h.instance_registered()) {
            register_instance(inst, v_h.value_ptr(), v_h.type);
            v_h.set_instance_registered();
        }
        init_holder(inst, v_h, (const holder_type *) holder_ptr, v_h.value_ptr<type>());
    }